

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::GenerateNotesFile(cmCTest *this,char *cfiles)

{
  int iVar1;
  ostream *poVar2;
  allocator local_1d9;
  VectorOfStrings files;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_1b8;
  ostringstream cmCTestLog_msg;
  
  if (cfiles == (char *)0x0) {
    iVar1 = 1;
  }
  else {
    files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Create notes file");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::stringbuf::str();
    iVar1 = 1;
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x6ad,(char *)local_1b8.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                       _M_impl.super__Vector_impl_data._M_start,false);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::string((string *)&cmCTestLog_msg,cfiles,&local_1d9);
    cmsys::SystemTools::SplitString(&local_1b8,(string *)&cmCTestLog_msg,';',false);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::_M_move_assign(&files,&local_1b8);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_1b8);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
        super__Vector_impl_data._M_start !=
        files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar1 = GenerateNotesFile(this,&files);
    }
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&files);
  }
  return iVar1;
}

Assistant:

int cmCTest::GenerateNotesFile(const char* cfiles)
{
  if ( !cfiles )
    {
    return 1;
    }

  VectorOfStrings files;

  cmCTestLog(this, OUTPUT, "Create notes file" << std::endl);

  files = cmSystemTools::SplitString(cfiles, ';');
  if (files.empty())
    {
    return 1;
    }

  return this->GenerateNotesFile(files);
}